

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall CConsole::ExecuteLineStroked(CConsole *this,int Stroke,char *pStr)

{
  char cVar1;
  char cVar2;
  long lVar3;
  CQueueEntry *pCVar4;
  int iVar5;
  CCommand *pCVar6;
  char *pcVar7;
  ulong uVar8;
  CConsole *pCVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  char aBuf [256];
  CResult Result;
  
  Result.m_apArgs[1] = (char *)0x0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
LAB_0012ba3e:
  if ((pStr != (char *)0x0) && (*pStr != '\0')) {
    Result.super_IResult.m_NumArgs = 0;
    Result.super_IResult._vptr_IResult = (_func_int **)&PTR__IResult_00164738;
    mem_zero(Result.m_aStringStorage,0x401);
    Result.m_pArgsStart = (char *)0x0;
    Result.m_pCommand = (char *)0x0;
    pCVar9 = (CConsole *)Result.m_apArgs;
    mem_zero(pCVar9,0x1000);
    pcVar10 = (char *)0x0;
    pcVar7 = pStr;
    do {
      cVar1 = *pcVar7;
      if (cVar1 == '\"') {
        pcVar10 = (char *)(ulong)((uint)pcVar10 ^ 1);
      }
      else if (cVar1 == '\\') {
        if (pcVar7[1] == '\"') {
          pcVar7 = pcVar7 + 1;
        }
      }
      else {
        if (cVar1 == '\0') {
          pcVar10 = (char *)0x0;
          goto LAB_0012bae6;
        }
        if ((uint)pcVar10 == 0) {
          pcVar10 = (char *)0x0;
          if (cVar1 == '#') goto LAB_0012bae6;
          if (cVar1 == ';') goto LAB_0012bae2;
        }
        else {
          pcVar10 = (char *)0x1;
        }
      }
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  goto LAB_0012bc74;
LAB_0012bae2:
  pcVar10 = pcVar7 + 1;
LAB_0012bae6:
  ParseStart(pCVar9,&Result,pStr,((int)pcVar7 - (int)pStr) + 1);
  cVar1 = *Result.m_pCommand;
  if (cVar1 == '\0') goto LAB_0012bc6b;
  pCVar9 = this;
  pCVar6 = FindCommand(this,Result.m_pCommand,this->m_FlagMask);
  pStr = pcVar10;
  if (pCVar6 == (CCommand *)0x0) {
    if (Stroke == 0) goto LAB_0012bc6b;
    pcVar10 = "No such command: %s.";
LAB_0012bb76:
    str_format(aBuf,0x100,pcVar10,Result.m_pCommand);
  }
  else {
    if ((pCVar6->super_CCommandInfo).m_AccessLevel < this->m_AccessLevel) {
      if (Stroke == 0) goto LAB_0012bc6b;
      pcVar10 = "Access for command %s denied.";
      goto LAB_0012bb76;
    }
    cVar2 = *Result.m_pCommand;
    if (cVar2 == '+') {
      uVar8 = (ulong)Result.super_IResult.m_NumArgs;
      Result.super_IResult.m_NumArgs = Result.super_IResult.m_NumArgs + 1;
      Result.m_apArgs[uVar8] = this->m_paStrokeStr[Stroke];
    }
    if (Stroke == 0 && cVar2 != '+') goto LAB_0012bc6b;
    iVar5 = ParseArgs(pCVar9,&Result,(pCVar6->super_CCommandInfo).m_pParams);
    if (iVar5 == 0) {
      if ((this->m_StoreCommands == true) && ((pCVar6->m_Flags & 8) != 0)) {
        CExecutionQueue::AddEntry(&this->m_ExecutionQueue);
        pCVar4 = (this->m_ExecutionQueue).m_pLast;
        pCVar4->m_pCommand = pCVar6;
        CResult::operator=(&pCVar4->m_Result,&Result);
      }
      else {
        (*pCVar6->m_pfnCallback)(&Result.super_IResult,pCVar6->m_pUserData);
      }
      goto LAB_0012bc6b;
    }
    str_format(aBuf,0x100,"Invalid arguments... Usage: %s %s",(pCVar6->super_CCommandInfo).m_pName,
               (pCVar6->super_CCommandInfo).m_pParams);
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])(this,0,"console",aBuf,0);
LAB_0012bc6b:
  if (cVar1 == '\0') {
LAB_0012bc74:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
      __stack_chk_fail();
    }
    return;
  }
  goto LAB_0012ba3e;
}

Assistant:

void CConsole::ExecuteLineStroked(int Stroke, const char *pStr)
{
	while(pStr && *pStr)
	{
		CResult Result;
		const char *pEnd = pStr;
		const char *pNextPart = 0;
		int InString = 0;

		while(*pEnd)
		{
			if(*pEnd == '"')
				InString ^= 1;
			else if(*pEnd == '\\') // escape sequences
			{
				if(pEnd[1] == '"')
					pEnd++;
			}
			else if(!InString)
			{
				if(*pEnd == ';') // command separator
				{
					pNextPart = pEnd+1;
					break;
				}
				else if(*pEnd == '#') // comment, no need to do anything more
					break;
			}

			pEnd++;
		}

		if(ParseStart(&Result, pStr, (pEnd-pStr) + 1) != 0)
			return;

		if(!*Result.m_pCommand)
			return;

		CCommand *pCommand = FindCommand(Result.m_pCommand, m_FlagMask);

		if(pCommand)
		{
			if(pCommand->GetAccessLevel() >= m_AccessLevel)
			{
				int IsStrokeCommand = 0;
				if(Result.m_pCommand[0] == '+')
				{
					// insert the stroke direction token
					Result.AddArgument(m_paStrokeStr[Stroke]);
					IsStrokeCommand = 1;
				}

				if(Stroke || IsStrokeCommand)
				{
					if(ParseArgs(&Result, pCommand->m_pParams))
					{
						char aBuf[256];
						str_format(aBuf, sizeof(aBuf), "Invalid arguments... Usage: %s %s", pCommand->m_pName, pCommand->m_pParams);
						Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
					}
					else if(m_StoreCommands && pCommand->m_Flags&CFGFLAG_STORE)
					{
						m_ExecutionQueue.AddEntry();
						m_ExecutionQueue.m_pLast->m_pCommand = pCommand;
						m_ExecutionQueue.m_pLast->m_Result = Result;
					}
					else
						pCommand->m_pfnCallback(&Result, pCommand->m_pUserData);
				}
			}
			else if(Stroke)
			{
				char aBuf[256];
				str_format(aBuf, sizeof(aBuf), "Access for command %s denied.", Result.m_pCommand);
				Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
			}
		}
		else if(Stroke)
		{
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "No such command: %s.", Result.m_pCommand);
			Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
		}

		pStr = pNextPart;
	}
}